

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O3

int __thiscall SafeQueue<int>::pop(SafeQueue<int> *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtx);
  if (iVar1 == 0) {
    iVar1 = *(this->m_queue).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    std::deque<int,_std::allocator<int>_>::pop_front(&(this->m_queue).c);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

virtual T pop()
    {
        std::lock_guard lk(m_mtx);

        T val = m_queue.front();
        m_queue.pop();

        return val;
    }